

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

Vec_Ptr_t *
Aig_ManPartitionSmart(Aig_Man_t *p,int nSuppSizeLimit,int fVerbose,Vec_Ptr_t **pvPartSupps)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  uint *__ptr;
  void *pvVar7;
  Vec_Ptr_t *vPartSuppsAll;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint *puVar11;
  long lVar12;
  long lVar13;
  Vec_Ptr_t *pVVar14;
  int iVar15;
  Aig_Man_t *pAVar16;
  ulong uVar17;
  uint uVar18;
  timespec ts;
  Vec_Ptr_t local_98;
  int local_84;
  Vec_Ptr_t *local_80;
  Vec_Ptr_t *local_78;
  Vec_Ptr_t *local_70;
  Aig_Man_t *local_68;
  long local_60;
  long local_58;
  long local_50;
  Vec_Ptr_t **local_48;
  int *local_40;
  void **local_38;
  
  local_84 = nSuppSizeLimit;
  local_68 = p;
  local_48 = pvPartSupps;
  iVar2 = clock_gettime(3,(timespec *)&local_98);
  if (iVar2 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_98.pArray),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_98._0_8_ * -1000000;
  }
  pAVar16 = local_68;
  pVVar4 = Aig_ManSupports(local_68);
  if (fVerbose != 0) {
    Abc_Print((int)pAVar16,"%s =","Supps");
    iVar15 = 3;
    iVar2 = clock_gettime(3,(timespec *)&local_98);
    if (iVar2 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = (long)local_98.pArray / 1000 + local_98._0_8_ * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar13 + lVar12) / 1000000.0);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pVVar14 = &local_98;
  local_80 = pVVar5;
  iVar2 = clock_gettime(3,(timespec *)pVVar14);
  if (iVar2 < 0) {
    local_58 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_98.pArray),8);
    local_58 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_98._0_8_ * -1000000;
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0x100;
  __ptr[1] = 0;
  pvVar7 = malloc(0x800);
  *(void **)(__ptr + 2) = pvVar7;
  vPartSuppsAll = (Vec_Ptr_t *)malloc(0x10);
  vPartSuppsAll->nCap = 0x100;
  vPartSuppsAll->nSize = 0;
  ppvVar6 = (void **)malloc(0x800);
  vPartSuppsAll->pArray = ppvVar6;
  local_60 = (long)pVVar4->nSize;
  pVVar5 = local_80;
  local_78 = vPartSuppsAll;
  local_70 = pVVar4;
  if (0 < local_60) {
    local_38 = pVVar4->pArray;
    lVar12 = 0;
    do {
      pVVar4 = (Vec_Ptr_t *)local_38[lVar12];
      local_50 = lVar12;
      if (pVVar4->nSize < 1) goto LAB_00634096;
      uVar3 = pVVar4->nSize - 1;
      pVVar4->nSize = uVar3;
      iVar2 = *(int *)((long)pVVar4->pArray + (ulong)uVar3 * 4);
      uVar3 = Aig_ManPartitionSmartFindPart
                        (vPartSuppsAll,pVVar14,pVVar5,local_84,(Vec_Int_t *)pVVar4);
      if (uVar3 == 0xffffffff) {
        pVVar9 = (Vec_Int_t *)malloc(0x10);
        pVVar9->nCap = 0x20;
        pVVar9->nSize = 0;
        piVar10 = (int *)malloc(0x80);
        pVVar9->pArray = piVar10;
        Vec_IntPush(pVVar9,iVar2);
        piVar10 = (int *)malloc(0x10);
        iVar2 = pVVar4->nSize;
        lVar12 = (long)iVar2;
        piVar10[1] = iVar2;
        *piVar10 = iVar2;
        if (lVar12 == 0) {
          pvVar7 = (void *)0x0;
        }
        else {
          pvVar7 = malloc(lVar12 * 4);
        }
        *(void **)(piVar10 + 2) = pvVar7;
        local_40 = piVar10;
        memcpy(pvVar7,pVVar4->pArray,lVar12 << 2);
        uVar3 = __ptr[1];
        uVar1 = *__ptr;
        if (uVar3 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar18 = 0x10;
          }
          else {
            uVar18 = uVar1 * 2;
            if ((int)uVar18 <= (int)uVar1) goto LAB_00633bdf;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc((ulong)uVar1 << 4);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = uVar18;
        }
LAB_00633bdf:
        pVVar14 = local_78;
        __ptr[1] = uVar3 + 1;
        *(Vec_Int_t **)(*(long *)(__ptr + 2) + (long)(int)uVar3 * 8) = pVVar9;
        uVar3 = local_78->nCap;
        if (local_78->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (local_78->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(local_78->pArray,0x80);
            }
            iVar2 = 0x10;
          }
          else {
            iVar2 = uVar3 * 2;
            if (iVar2 <= (int)uVar3) goto LAB_00633c53;
            if (local_78->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(local_78->pArray,(ulong)uVar3 << 4);
            }
          }
          pVVar14->pArray = ppvVar6;
          pVVar14->nCap = iVar2;
        }
LAB_00633c53:
        iVar2 = pVVar14->nSize;
        pVVar14->nSize = iVar2 + 1;
        pVVar14->pArray[iVar2] = local_40;
        pVVar14 = (Vec_Ptr_t *)(ulong)(uint)local_68->nObjs[2];
        puVar11 = Aig_ManSuppCharStart((Vec_Int_t *)pVVar4,local_68->nObjs[2]);
        uVar3 = pVVar5->nSize;
        uVar1 = pVVar5->nCap;
        pVVar4 = pVVar14;
        if (uVar3 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              pVVar14 = (Vec_Ptr_t *)0x80;
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            iVar2 = 0x10;
          }
          else {
            iVar2 = uVar1 * 2;
            if (iVar2 <= (int)uVar1) goto LAB_00633ce1;
            pVVar14 = (Vec_Ptr_t *)((ulong)uVar1 << 4);
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((size_t)pVVar14);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,(size_t)pVVar14);
            }
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar2;
          pVVar4 = pVVar14;
        }
LAB_00633ce1:
        pVVar5->nSize = uVar3 + 1;
        pVVar5->pArray[(int)uVar3] = puVar11;
        vPartSuppsAll = local_78;
      }
      else {
        if (((int)uVar3 < 0) || ((int)__ptr[1] <= (int)uVar3)) goto LAB_00634077;
        uVar17 = (ulong)uVar3;
        Vec_IntPush(*(Vec_Int_t **)(*(long *)(__ptr + 2) + uVar17 * 8),iVar2);
        if (vPartSuppsAll->nSize <= (int)uVar3) goto LAB_00634077;
        pVVar9 = (Vec_Int_t *)vPartSuppsAll->pArray[uVar17];
        pVVar8 = Vec_IntTwoMerge(pVVar9,(Vec_Int_t *)pVVar4);
        if (pVVar9->pArray != (int *)0x0) {
          free(pVVar9->pArray);
          pVVar9->pArray = (int *)0x0;
        }
        if (pVVar9 != (Vec_Int_t *)0x0) {
          free(pVVar9);
        }
        vPartSuppsAll = local_78;
        pVVar5 = local_80;
        if (local_78->nSize <= (int)uVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        local_78->pArray[uVar17] = pVVar8;
        if (local_80->nSize <= (int)uVar3) goto LAB_00634077;
        Aig_ManSuppCharAdd((uint *)local_80->pArray[uVar17],(Vec_Int_t *)pVVar4,local_68->nObjs[2]);
      }
      lVar12 = local_50 + 1;
      pVVar14 = pVVar4;
    } while (local_60 != lVar12);
  }
  iVar2 = pVVar5->nSize;
  if (0 < (long)iVar2) {
    ppvVar6 = local_80->pArray;
    lVar12 = 0;
    do {
      if (ppvVar6[lVar12] != (void *)0x0) {
        free(ppvVar6[lVar12]);
      }
      lVar12 = lVar12 + 1;
    } while (iVar2 != lVar12);
  }
  pVVar4 = local_80;
  if (local_80->pArray != (void **)0x0) {
    free(local_80->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  free(pVVar4);
  if (fVerbose != 0) {
    Abc_Print((int)pVVar4,"%s =","Parts");
    iVar15 = 3;
    iVar2 = clock_gettime(3,(timespec *)&local_98);
    if (iVar2 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = (long)local_98.pArray / 1000 + local_98._0_8_ * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar12 + local_58) / 1000000.0);
  }
  clock_gettime(3,(timespec *)&local_98);
  iVar2 = vPartSuppsAll->nSize;
  if (0 < iVar2) {
    lVar12 = 0;
    do {
      Vec_IntPush((Vec_Int_t *)vPartSuppsAll->pArray[lVar12],(int)lVar12);
      lVar12 = lVar12 + 1;
      iVar2 = vPartSuppsAll->nSize;
    } while (lVar12 < iVar2);
  }
  qsort(vPartSuppsAll->pArray,(long)iVar2,8,Vec_VecSortCompare2);
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 0x100;
  pVVar4->nSize = 0;
  ppvVar6 = (void **)malloc(0x800);
  pVVar4->pArray = ppvVar6;
  if (0 < vPartSuppsAll->nSize) {
    lVar12 = 0;
    do {
      pvVar7 = vPartSuppsAll->pArray[lVar12];
      if (*(int *)((long)pvVar7 + 4) < 1) {
LAB_00634096:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar3 = *(int *)((long)pvVar7 + 4) - 1;
      *(uint *)((long)pvVar7 + 4) = uVar3;
      iVar2 = *(int *)(*(long *)((long)pvVar7 + 8) + (ulong)uVar3 * 4);
      if (((long)iVar2 < 0) || ((int)__ptr[1] <= iVar2)) {
LAB_00634077:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar7 = *(void **)(*(long *)(__ptr + 2) + (long)iVar2 * 8);
      uVar3 = pVVar4->nSize;
      uVar1 = pVVar4->nCap;
      if (uVar3 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar4->pArray,0x80);
          }
          iVar2 = 0x10;
        }
        else {
          iVar2 = uVar1 * 2;
          if (iVar2 <= (int)uVar1) goto LAB_00633f14;
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
          }
        }
        pVVar4->pArray = ppvVar6;
        pVVar4->nCap = iVar2;
      }
LAB_00633f14:
      pVVar4->nSize = uVar3 + 1;
      pVVar4->pArray[(int)uVar3] = pvVar7;
      lVar12 = lVar12 + 1;
      vPartSuppsAll = local_78;
    } while (lVar12 < local_78->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  Aig_ManPartitionCompact(pVVar4,vPartSuppsAll,local_84);
  if (fVerbose != 0) {
    printf("Created %d partitions.\n",(ulong)(uint)pVVar4->nSize);
  }
  if (0 < (int)local_60) {
    ppvVar6 = local_70->pArray;
    lVar12 = 0;
    do {
      pvVar7 = ppvVar6[lVar12];
      if (pvVar7 != (void *)0x0) {
        if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar7 + 8));
          *(undefined8 *)((long)pvVar7 + 8) = 0;
        }
        free(pvVar7);
      }
      lVar12 = lVar12 + 1;
    } while (local_60 != lVar12);
  }
  pVVar14 = local_70;
  if (local_70->pArray != (void **)0x0) {
    free(local_70->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  if (local_48 == (Vec_Ptr_t **)0x0) {
    if (0 < vPartSuppsAll->nSize) {
      lVar12 = 0;
      do {
        pvVar7 = vPartSuppsAll->pArray[lVar12];
        if (pvVar7 != (void *)0x0) {
          if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar7 + 8));
            *(undefined8 *)((long)pvVar7 + 8) = 0;
          }
          free(pvVar7);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < vPartSuppsAll->nSize);
    }
    if (vPartSuppsAll->pArray != (void **)0x0) {
      free(vPartSuppsAll->pArray);
      vPartSuppsAll->pArray = (void **)0x0;
    }
    free(vPartSuppsAll);
  }
  else {
    *local_48 = vPartSuppsAll;
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmart( Aig_Man_t * p, int nSuppSizeLimit, int fVerbose, Vec_Ptr_t ** pvPartSupps )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;//, * vPartPtr;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // compute the supports for all outputs
clk = Abc_Clock();
    vSupports = Aig_ManSupports( p );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Aig_ManCiNum(p)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Aig_ManCiNum(p) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
    else
        *pvPartSupps = vPartSuppsAll;
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}